

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::LRN_x86_avx::forward_inplace(LRN_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  size_t _elemsize;
  _func_int **pp_Var1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int *piVar6;
  pointer piVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  Mat *pMVar12;
  _func_int ***ppp_Var13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  float *pfVar17;
  undefined1 (*pauVar18) [32];
  uint uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  void *pvVar25;
  Mat *pMVar26;
  ulong uVar27;
  float fVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  allocator_type local_1e9;
  Mat local_1e8;
  Mat *local_198;
  Mat *local_190;
  Mat *local_188;
  Mat *local_180;
  _func_int ***local_178;
  undefined8 local_170;
  Mat local_168;
  undefined8 local_118;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  long local_e0;
  Allocator *local_d8;
  long local_d0;
  void *local_c8;
  long local_c0;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [32];
  vector<int,_std::allocator<int>_> _space_ofs;
  
  local_118 = (ulong)(uint)bottom_top_blob->w;
  local_198 = (Mat *)(ulong)(uint)bottom_top_blob->h;
  uVar15 = bottom_top_blob->c;
  pMVar26 = (Mat *)(ulong)uVar15;
  _elemsize = bottom_top_blob->elemsize;
  local_168.cstep = 0;
  local_168.data = (Allocator *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.elemsize._0_4_ = 0;
  local_168.elempack = 0;
  local_168._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_168.elemsize._4_4_ = (int)local_168.refcount;
  local_168.allocator = (Allocator *)local_168.data;
  local_168.dims = (int)local_168.refcount;
  local_168.w = local_168.refcount._4_4_;
  local_168.c = local_168.elempack;
  Mat::create(&local_168,bottom_top_blob->w,bottom_top_blob->h,uVar15,_elemsize,
              opt->workspace_allocator);
  iVar10 = -100;
  if (((Allocator *)local_168.data == (Allocator *)0x0) ||
     ((long)local_168.c * local_168.cstep == 0)) goto LAB_0031f121;
  uVar19 = (int)local_198 * (int)local_118;
  if (0 < (int)uVar15) {
    pMVar12 = (Mat *)0x0;
    do {
      pfVar17 = (float *)(bottom_top_blob->cstep * (long)pMVar12 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      ppp_Var13 = (_func_int ***)
                  ((long)(_func_int ***)local_168.data +
                  local_168.cstep * (long)pMVar12 *
                  CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize));
      if ((int)uVar19 < 8) {
        uVar9 = 0;
      }
      else {
        iVar21 = 7;
        do {
          auVar2._4_4_ = pfVar17[1] * pfVar17[1];
          auVar2._0_4_ = *pfVar17 * *pfVar17;
          auVar2._8_4_ = pfVar17[2] * pfVar17[2];
          auVar2._12_4_ = pfVar17[3] * pfVar17[3];
          auVar2._16_4_ = pfVar17[4] * pfVar17[4];
          auVar2._20_4_ = pfVar17[5] * pfVar17[5];
          auVar2._24_4_ = pfVar17[6] * pfVar17[6];
          auVar2._28_4_ = pfVar17[7];
          *(undefined1 (*) [32])ppp_Var13 = auVar2;
          pfVar17 = pfVar17 + 8;
          ppp_Var13 = ppp_Var13 + 4;
          iVar21 = iVar21 + 8;
          uVar9 = uVar19 & 0xfffffff8;
        } while (iVar21 < (int)uVar19);
      }
      if (uVar19 - uVar9 != 0 && (int)uVar9 <= (int)uVar19) {
        lVar24 = 0;
        do {
          *(float *)((long)ppp_Var13 + lVar24 * 4) = pfVar17[lVar24] * pfVar17[lVar24];
          lVar24 = lVar24 + 1;
        } while (uVar19 - uVar9 != (int)lVar24);
      }
      pMVar12 = (Mat *)((long)&pMVar12->data + 1);
    } while (pMVar12 != pMVar26);
  }
  local_188 = pMVar26;
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_LRN_x86_avx[-3]) == 0) {
    local_1e8.cstep = 0;
    local_1e8.data = (void *)0x0;
    local_1e8.refcount._0_4_ = 0;
    local_1e8.refcount._4_4_ = 0;
    local_1e8.elemsize._0_4_ = 0;
    local_1e8.elemsize._4_4_ = 0;
    local_1e8.elempack = 0;
    local_1e8.allocator = (Allocator *)0x0;
    local_1e8.dims = 0;
    local_1e8.w = 0;
    local_1e8.h = 0;
    local_1e8.d = 0;
    local_1e8.c = 0;
    Mat::create(&local_1e8,(int)local_118,(int)local_198,uVar15,_elemsize,opt->workspace_allocator);
    bVar8 = local_1e8.data == (void *)0x0 || (long)local_1e8.c * local_1e8.cstep == 0;
    if (bVar8) {
      piVar6 = (int *)CONCAT44(local_1e8.refcount._4_4_,(int)local_1e8.refcount);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_1e8.allocator == (Allocator *)0x0) {
            if (local_1e8.data != (void *)0x0) {
              free(local_1e8.data);
            }
          }
          else {
            (*(local_1e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_1e8.cstep = 0;
      local_1e8.data = (void *)0x0;
      local_1e8.refcount._0_4_ = 0;
      local_1e8.refcount._4_4_ = 0;
      local_1e8.elemsize._0_4_ = 0;
      local_1e8.elemsize._4_4_ = 0;
      local_1e8.elempack = 0;
      local_1e8.dims = 0;
      local_1e8.w = 0;
      local_1e8.h = 0;
      local_1e8.d = 0;
      local_1e8.c = 0;
      goto LAB_0031f121;
    }
    local_178 = (_func_int ***)CONCAT71(local_178._1_7_,bVar8);
    local_198 = bottom_top_blob;
    if (0 < local_1e8.c * (int)local_1e8.cstep) {
      memset(local_1e8.data,0,(ulong)(uint)(local_1e8.c * (int)local_1e8.cstep) << 2);
    }
    if (0 < (int)uVar15) {
      local_f8 = ZEXT416((uint)(*(float *)(&this->field_0xd8 + (long)this->_vptr_LRN_x86_avx[-3]) /
                               (float)*(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx[-3]
                                              )));
      auVar51 = ZEXT1664(local_f8);
      pp_Var1 = this->_vptr_LRN_x86_avx;
      auVar32 = vshufps_avx(local_f8,local_f8,0);
      register0x00001250 = auVar32;
      _local_b8 = auVar32;
      pMVar12 = (Mat *)0x0;
      local_170 = CONCAT44(local_170._4_4_,uVar19) & 0xfffffffffffffff8;
      uVar15 = uVar19 & 0xfffffff8;
      do {
        auVar53._8_4_ = 0x3f000000;
        auVar53._0_8_ = 0x3f0000003f000000;
        auVar53._12_4_ = 0x3f000000;
        auVar53._16_4_ = 0x3f000000;
        auVar53._20_4_ = 0x3f000000;
        auVar53._24_4_ = 0x3f000000;
        auVar53._28_4_ = 0x3f000000;
        iVar10 = *(int *)(&this->field_0xd4 + (long)pp_Var1[-3]) / 2;
        iVar21 = (int)pMVar12;
        uVar9 = iVar21 - iVar10;
        if ((int)uVar9 <= iVar10 + iVar21) {
          do {
            if (uVar9 < (uint)pMVar26) {
              ppp_Var13 = (_func_int ***)
                          ((long)(_func_int ***)local_168.data +
                          uVar9 * local_168.cstep *
                          CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize));
              pauVar18 = (undefined1 (*) [32])
                         (local_1e8.cstep * (long)pMVar12 *
                          CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize) +
                         (long)local_1e8.data);
              uVar22 = 0;
              if (7 < (int)uVar19) {
                iVar10 = 7;
                do {
                  auVar29._0_4_ = *(float *)*pauVar18 + *(float *)ppp_Var13;
                  auVar29._4_4_ = *(float *)(*pauVar18 + 4) + *(float *)((long)ppp_Var13 + 4);
                  auVar29._8_4_ = *(float *)(*pauVar18 + 8) + *(float *)(ppp_Var13 + 1);
                  auVar29._12_4_ =
                       *(float *)(*pauVar18 + 0xc) + *(float *)((long)(ppp_Var13 + 1) + 4);
                  auVar29._16_4_ = *(float *)(*pauVar18 + 0x10) + *(float *)(ppp_Var13 + 2);
                  auVar29._20_4_ =
                       *(float *)(*pauVar18 + 0x14) + *(float *)((long)(ppp_Var13 + 2) + 4);
                  auVar29._24_4_ = *(float *)(*pauVar18 + 0x18) + *(float *)(ppp_Var13 + 3);
                  auVar29._28_4_ =
                       *(float *)(*pauVar18 + 0x1c) + *(float *)((long)(ppp_Var13 + 3) + 4);
                  *pauVar18 = auVar29;
                  ppp_Var13 = ppp_Var13 + 4;
                  pauVar18 = pauVar18 + 1;
                  iVar10 = iVar10 + 8;
                  uVar22 = uVar15;
                } while (iVar10 < (int)uVar19);
              }
              if (uVar19 - uVar22 != 0 && (int)uVar22 <= (int)uVar19) {
                lVar24 = 0;
                do {
                  *(float *)(*pauVar18 + lVar24 * 4) =
                       *(float *)(*pauVar18 + lVar24 * 4) + *(float *)((long)ppp_Var13 + lVar24 * 4)
                  ;
                  lVar24 = lVar24 + 1;
                } while (uVar19 - uVar22 != (int)lVar24);
              }
            }
            bVar8 = (int)uVar9 < *(int *)(&this->field_0xd4 + (long)pp_Var1[-3]) / 2 + iVar21;
            uVar9 = uVar9 + 1;
          } while (bVar8);
        }
        pauVar18 = (undefined1 (*) [32])
                   (local_198->cstep * (long)pMVar12 * local_198->elemsize + (long)local_198->data);
        pfVar17 = (float *)(local_1e8.cstep * (long)pMVar12 *
                            CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize) +
                           (long)local_1e8.data);
        uVar9 = 0;
        if (7 < (int)uVar19) {
          fStack_110 = *(float *)(&this->field_0xe0 + (long)pp_Var1[-3]);
          local_118 = CONCAT44(fStack_110,fStack_110);
          fVar28 = *(float *)(&this->field_0xdc + (long)pp_Var1[-3]);
          auVar32._0_8_ = CONCAT44(fVar28,fVar28) ^ 0x8000000080000000;
          auVar32._8_4_ = -fVar28;
          auVar32._12_4_ = -fVar28;
          auVar30._16_16_ = auVar32;
          auVar30._0_16_ = auVar32;
          iVar10 = 7;
          auVar54._8_4_ = 0xc2b0c0a5;
          auVar54._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar54._12_4_ = 0xc2b0c0a5;
          auVar54._16_4_ = 0xc2b0c0a5;
          auVar54._20_4_ = 0xc2b0c0a5;
          auVar54._24_4_ = 0xc2b0c0a5;
          auVar54._28_4_ = 0xc2b0c0a5;
          auVar31._8_4_ = 0x3f800000;
          auVar31._0_8_ = 0x3f8000003f800000;
          auVar31._12_4_ = 0x3f800000;
          auVar31._16_4_ = 0x3f800000;
          auVar31._20_4_ = 0x3f800000;
          auVar31._24_4_ = 0x3f800000;
          auVar31._28_4_ = 0x3f800000;
          auVar33._8_4_ = 0xffffff81;
          auVar33._0_8_ = 0xffffff81ffffff81;
          auVar33._12_4_ = 0xffffff81;
          auVar52._8_4_ = 0x3f800000;
          auVar52._0_8_ = 0x3f8000003f800000;
          auVar52._12_4_ = 0x3f800000;
          do {
            auVar34._0_4_ = (float)local_b8._0_4_ * *pfVar17 + fStack_110;
            auVar34._4_4_ = (float)local_b8._4_4_ * pfVar17[1] + fStack_110;
            auVar34._8_4_ = fStack_b0 * pfVar17[2] + fStack_110;
            auVar34._12_4_ = fStack_ac * pfVar17[3] + fStack_110;
            auVar34._16_4_ = fStack_a8 * pfVar17[4] + fStack_110;
            auVar34._20_4_ = fStack_a4 * pfVar17[5] + fStack_110;
            auVar34._24_4_ = fStack_a0 * pfVar17[6] + fStack_110;
            auVar34._28_4_ = fStack_9c + fStack_110;
            auVar35._8_4_ = 0x800000;
            auVar35._0_8_ = 0x80000000800000;
            auVar35._12_4_ = 0x800000;
            auVar35._16_4_ = 0x800000;
            auVar35._20_4_ = 0x800000;
            auVar35._24_4_ = 0x800000;
            auVar35._28_4_ = 0x800000;
            auVar3 = vmaxps_avx(auVar34,auVar35);
            auVar48._8_4_ = 0x807fffff;
            auVar48._0_8_ = 0x807fffff807fffff;
            auVar48._12_4_ = 0x807fffff;
            auVar48._16_4_ = 0x807fffff;
            auVar48._20_4_ = 0x807fffff;
            auVar48._24_4_ = 0x807fffff;
            auVar48._28_4_ = 0x807fffff;
            auVar2 = vandps_avx(auVar3,auVar48);
            auVar4 = vorps_avx(auVar53,auVar2);
            auVar49._8_4_ = 0x3f3504f3;
            auVar49._0_8_ = 0x3f3504f33f3504f3;
            auVar49._12_4_ = 0x3f3504f3;
            auVar49._16_4_ = 0x3f3504f3;
            auVar49._20_4_ = 0x3f3504f3;
            auVar49._24_4_ = 0x3f3504f3;
            auVar49._28_4_ = 0x3f3504f3;
            auVar29 = vcmpps_avx(auVar49,auVar4,2);
            auVar50 = vpsrld_avx(auVar3._16_16_,0x17);
            auVar2 = vandnps_avx(auVar29,auVar4);
            fVar28 = auVar4._0_4_ + -1.0 + auVar2._0_4_;
            fVar40 = auVar4._4_4_ + -1.0 + auVar2._4_4_;
            fVar41 = auVar4._8_4_ + -1.0 + auVar2._8_4_;
            fVar42 = auVar4._12_4_ + -1.0 + auVar2._12_4_;
            fVar43 = auVar4._16_4_ + -1.0 + auVar2._16_4_;
            fVar44 = auVar4._20_4_ + -1.0 + auVar2._20_4_;
            fVar45 = auVar4._24_4_ + -1.0 + auVar2._24_4_;
            auVar47 = vpsubd_avx(auVar50,auVar29._16_16_);
            auVar50 = vpsrld_avx(auVar3._0_16_,0x17);
            auVar50 = vpsubd_avx(auVar50,auVar29._0_16_);
            auVar50 = vpaddd_avx(auVar50,auVar33);
            auVar47 = vpaddd_avx(auVar47,auVar33);
            auVar46._16_16_ = auVar47;
            auVar46._0_16_ = auVar50;
            auVar3 = vcvtdq2ps_avx(auVar46);
            auVar29 = vcmpps_avx(auVar34,_DAT_00599260,2);
            auVar36._0_4_ =
                 auVar3._0_4_ * 0.6931472 + fVar28 +
                 fVar28 * fVar28 *
                 (((((((((fVar28 * 0.070376836 + -0.1151461) * fVar28 + 0.116769984) * fVar28 +
                       -0.12420141) * fVar28 + 0.14249323) * fVar28 + -0.16668057) * fVar28 +
                    0.20000714) * fVar28 + -0.24999994) * fVar28 + 0.3333333) * fVar28 + -0.5);
            auVar36._4_4_ =
                 auVar3._4_4_ * 0.6931472 + fVar40 +
                 fVar40 * fVar40 *
                 (((((((((fVar40 * 0.070376836 + -0.1151461) * fVar40 + 0.116769984) * fVar40 +
                       -0.12420141) * fVar40 + 0.14249323) * fVar40 + -0.16668057) * fVar40 +
                    0.20000714) * fVar40 + -0.24999994) * fVar40 + 0.3333333) * fVar40 + -0.5);
            auVar36._8_4_ =
                 auVar3._8_4_ * 0.6931472 + fVar41 +
                 fVar41 * fVar41 *
                 (((((((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) * fVar41 +
                       -0.12420141) * fVar41 + 0.14249323) * fVar41 + -0.16668057) * fVar41 +
                    0.20000714) * fVar41 + -0.24999994) * fVar41 + 0.3333333) * fVar41 + -0.5);
            auVar36._12_4_ =
                 auVar3._12_4_ * 0.6931472 + fVar42 +
                 fVar42 * fVar42 *
                 (((((((((fVar42 * 0.070376836 + -0.1151461) * fVar42 + 0.116769984) * fVar42 +
                       -0.12420141) * fVar42 + 0.14249323) * fVar42 + -0.16668057) * fVar42 +
                    0.20000714) * fVar42 + -0.24999994) * fVar42 + 0.3333333) * fVar42 + -0.5);
            auVar36._16_4_ =
                 auVar3._16_4_ * 0.6931472 + fVar43 +
                 fVar43 * fVar43 *
                 (((((((((fVar43 * 0.070376836 + -0.1151461) * fVar43 + 0.116769984) * fVar43 +
                       -0.12420141) * fVar43 + 0.14249323) * fVar43 + -0.16668057) * fVar43 +
                    0.20000714) * fVar43 + -0.24999994) * fVar43 + 0.3333333) * fVar43 + -0.5);
            auVar36._20_4_ =
                 auVar3._20_4_ * 0.6931472 + fVar44 +
                 fVar44 * fVar44 *
                 (((((((((fVar44 * 0.070376836 + -0.1151461) * fVar44 + 0.116769984) * fVar44 +
                       -0.12420141) * fVar44 + 0.14249323) * fVar44 + -0.16668057) * fVar44 +
                    0.20000714) * fVar44 + -0.24999994) * fVar44 + 0.3333333) * fVar44 + -0.5);
            auVar36._24_4_ =
                 auVar3._24_4_ * 0.6931472 + fVar45 +
                 fVar45 * fVar45 *
                 (((((((((fVar45 * 0.070376836 + -0.1151461) * fVar45 + 0.116769984) * fVar45 +
                       -0.12420141) * fVar45 + 0.14249323) * fVar45 + -0.16668057) * fVar45 +
                    0.20000714) * fVar45 + -0.24999994) * fVar45 + 0.3333333) * fVar45 + -0.5);
            auVar36._28_4_ = auVar3._28_4_ + auVar4._28_4_ + -1.0 + auVar2._28_4_ + -0.16666669;
            auVar2 = vorps_avx(auVar29,auVar36);
            local_98._0_4_ = (undefined4)auVar32._0_8_;
            local_98._4_4_ = (undefined4)(auVar32._0_8_ >> 0x20);
            auVar3._4_4_ = auVar2._4_4_ * (float)local_98._4_4_;
            auVar3._0_4_ = auVar2._0_4_ * (float)local_98._0_4_;
            auVar3._8_4_ = auVar2._8_4_ * auVar32._8_4_;
            auVar3._12_4_ = auVar2._12_4_ * auVar32._12_4_;
            auVar3._16_4_ = auVar2._16_4_ * (float)local_98._0_4_;
            auVar3._20_4_ = auVar2._20_4_ * (float)local_98._4_4_;
            auVar3._24_4_ = auVar2._24_4_ * auVar32._8_4_;
            auVar3._28_4_ = auVar2._28_4_;
            auVar37._8_4_ = 0x42b0c0a5;
            auVar37._0_8_ = 0x42b0c0a542b0c0a5;
            auVar37._12_4_ = 0x42b0c0a5;
            auVar37._16_4_ = 0x42b0c0a5;
            auVar37._20_4_ = 0x42b0c0a5;
            auVar37._24_4_ = 0x42b0c0a5;
            auVar37._28_4_ = 0x42b0c0a5;
            auVar2 = vminps_avx(auVar3,auVar37);
            auVar29 = vmaxps_avx(auVar54,auVar2);
            auVar38._0_4_ = auVar29._0_4_ * 1.442695 + 0.5;
            auVar38._4_4_ = auVar29._4_4_ * 1.442695 + 0.5;
            auVar38._8_4_ = auVar29._8_4_ * 1.442695 + 0.5;
            auVar38._12_4_ = auVar29._12_4_ * 1.442695 + 0.5;
            auVar38._16_4_ = auVar29._16_4_ * 1.442695 + 0.5;
            auVar38._20_4_ = auVar29._20_4_ * 1.442695 + 0.5;
            auVar38._24_4_ = auVar29._24_4_ * 1.442695 + 0.5;
            auVar38._28_4_ = 0x3ff8aa3b;
            auVar3 = vroundps_avx(auVar38,1);
            auVar2 = vcmpps_avx(auVar38,auVar3,1);
            auVar2 = vandps_avx(auVar2,auVar31);
            auVar2 = vsubps_avx(auVar3,auVar2);
            auVar4._4_4_ = auVar2._4_4_ * 0.6931472;
            auVar4._0_4_ = auVar2._0_4_ * 0.6931472;
            auVar4._8_4_ = auVar2._8_4_ * 0.6931472;
            auVar4._12_4_ = auVar2._12_4_ * 0.6931472;
            auVar4._16_4_ = auVar2._16_4_ * 0.6931472;
            auVar4._20_4_ = auVar2._20_4_ * 0.6931472;
            auVar4._24_4_ = auVar2._24_4_ * 0.6931472;
            auVar4._28_4_ = auVar3._28_4_;
            auVar29 = vsubps_avx(auVar29,auVar4);
            fVar28 = auVar29._0_4_;
            fVar40 = auVar29._4_4_;
            fVar41 = auVar29._8_4_;
            fVar42 = auVar29._12_4_;
            fVar43 = auVar29._16_4_;
            fVar44 = auVar29._20_4_;
            fVar45 = auVar29._24_4_;
            auVar50._0_4_ = (int)auVar2._0_4_;
            auVar50._4_4_ = (int)auVar2._4_4_;
            auVar50._8_4_ = (int)auVar2._8_4_;
            auVar50._12_4_ = (int)auVar2._12_4_;
            auVar39._16_4_ = (int)auVar2._16_4_;
            auVar39._0_16_ = auVar50;
            auVar39._20_4_ = (int)auVar2._20_4_;
            auVar39._24_4_ = (int)auVar2._24_4_;
            auVar39._28_4_ = (int)auVar2._28_4_;
            auVar47 = vpslld_avx(auVar50,0x17);
            auVar50 = vpslld_avx(auVar39._16_16_,0x17);
            auVar50 = vpaddd_avx(auVar52,auVar50);
            auVar47 = vpaddd_avx(auVar52,auVar47);
            auVar5._4_4_ = auVar47._4_4_ * *(float *)(*pauVar18 + 4) *
                           (fVar40 + 1.0 +
                           fVar40 * fVar40 *
                           (((((fVar40 * 0.00019875691 + 0.0013981999) * fVar40 + 0.008333452) *
                              fVar40 + 0.041665796) * fVar40 + 0.16666666) * fVar40 + 0.5));
            auVar5._0_4_ = auVar47._0_4_ * *(float *)*pauVar18 *
                           (fVar28 + 1.0 +
                           fVar28 * fVar28 *
                           (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) *
                              fVar28 + 0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5));
            auVar5._8_4_ = auVar47._8_4_ * *(float *)(*pauVar18 + 8) *
                           (fVar41 + 1.0 +
                           fVar41 * fVar41 *
                           (((((fVar41 * 0.00019875691 + 0.0013981999) * fVar41 + 0.008333452) *
                              fVar41 + 0.041665796) * fVar41 + 0.16666666) * fVar41 + 0.5));
            auVar5._12_4_ =
                 auVar47._12_4_ * *(float *)(*pauVar18 + 0xc) *
                 (fVar42 + 1.0 +
                 fVar42 * fVar42 *
                 (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) * fVar42 +
                   0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5));
            auVar5._16_4_ =
                 auVar50._0_4_ * *(float *)(*pauVar18 + 0x10) *
                 (fVar43 + 1.0 +
                 fVar43 * fVar43 *
                 (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                   0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5));
            auVar5._20_4_ =
                 auVar50._4_4_ * *(float *)(*pauVar18 + 0x14) *
                 (fVar44 + 1.0 +
                 fVar44 * fVar44 *
                 (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                   0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5));
            auVar5._24_4_ =
                 auVar50._8_4_ * *(float *)(*pauVar18 + 0x18) *
                 (fVar45 + 1.0 +
                 fVar45 * fVar45 *
                 (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                   0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5));
            auVar5._28_4_ = auVar29._28_4_ + 1.0 + 0.71826285;
            *pauVar18 = auVar5;
            pfVar17 = pfVar17 + 8;
            pauVar18 = pauVar18 + 1;
            iVar10 = iVar10 + 8;
            uVar9 = uVar15;
            fStack_10c = fStack_110;
            fStack_108 = fStack_110;
            fStack_104 = fStack_110;
            fStack_100 = fStack_110;
            fStack_fc = fStack_110;
            local_98 = auVar30;
          } while (iVar10 < (int)uVar19);
        }
        local_190 = pMVar12;
        if (uVar19 - uVar9 != 0 && (int)uVar9 <= (int)uVar19) {
          lVar24 = 0;
          do {
            fVar28 = powf(auVar51._0_4_ * pfVar17[lVar24] +
                          *(float *)(&this->field_0xe0 + (long)pp_Var1[-3]),
                          -*(float *)(&this->field_0xdc + (long)pp_Var1[-3]));
            auVar51 = ZEXT1664(local_f8);
            *(float *)(*pauVar18 + lVar24 * 4) = fVar28 * *(float *)(*pauVar18 + lVar24 * 4);
            lVar24 = lVar24 + 1;
          } while (uVar19 - uVar9 != (int)lVar24);
        }
        pMVar12 = (Mat *)((long)&local_190->data + 1);
        pMVar26 = local_188;
        uVar15 = (uint)local_170;
      } while (pMVar12 != local_188);
    }
    piVar6 = (int *)CONCAT44(local_1e8.refcount._4_4_,(int)local_1e8.refcount);
    iVar10 = -100;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_1e8.allocator == (Allocator *)0x0) {
          if (local_1e8.data != (void *)0x0) {
            free(local_1e8.data);
          }
        }
        else {
          (*(local_1e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1e8.cstep = 0;
    local_1e8.data = (void *)0x0;
    local_1e8.refcount._0_4_ = 0;
    local_1e8.refcount._4_4_ = 0;
    local_1e8.elemsize._0_4_ = 0;
    local_1e8.elemsize._4_4_ = 0;
    local_1e8.elempack = 0;
    local_1e8.dims = 0;
    local_1e8.w = 0;
    local_1e8.h = 0;
    local_1e8.d = 0;
    local_1e8.c = 0;
    if ((char)local_178 != '\0') goto LAB_0031f121;
  }
  else if (*(int *)(&this->field_0xd0 + (long)this->_vptr_LRN_x86_avx[-3]) == 1) {
    piVar6 = (int *)CONCAT44(local_168.refcount._4_4_,(int)local_168.refcount);
    local_1e8.data = local_168.data;
    local_1e8.refcount._0_4_ = (int)local_168.refcount;
    local_1e8.refcount._4_4_ = local_168.refcount._4_4_;
    local_1e8.elemsize._0_4_ = (undefined4)local_168.elemsize;
    local_1e8.elemsize._4_4_ = local_168.elemsize._4_4_;
    local_1e8.elempack = local_168.elempack;
    local_1e8.allocator = local_168.allocator;
    local_1e8.dims = local_168.dims;
    local_1e8.w = local_168.w;
    local_1e8.h = local_168.h;
    local_1e8.d = local_168.d;
    local_1e8.c = local_168.c;
    local_1e8.cstep = local_168.cstep;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    iVar21 = (int)local_118;
    if (1 < (int)*(uint *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx[-3])) {
      uVar15 = *(uint *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx[-3]) >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      iVar21 = ~uVar15 + *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx[-3]);
      copy_make_border(&local_168,&local_1e8,uVar15,iVar21,uVar15,iVar21,0,0.0,(Option *)&_space_ofs
                      );
      iVar21 = local_1e8.w;
      if ((Allocator *)local_1e8.data == (Allocator *)0x0 ||
          (long)local_1e8.c * local_1e8.cstep == 0) {
        piVar6 = (int *)CONCAT44(local_1e8.refcount._4_4_,(int)local_1e8.refcount);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_1e8.allocator == (Allocator *)0x0) {
              if ((Allocator *)local_1e8.data != (Allocator *)0x0) {
                free(local_1e8.data);
              }
            }
            else {
              (*(local_1e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_1e8.cstep = 0;
        local_1e8.data = (void *)0x0;
        local_1e8.refcount._0_4_ = 0;
        local_1e8.refcount._4_4_ = 0;
        local_1e8.elemsize._0_4_ = 0;
        local_1e8.elemsize._4_4_ = 0;
        local_1e8.elempack = 0;
        local_1e8.dims = 0;
        local_1e8.w = 0;
        local_1e8.h = 0;
        local_1e8.d = 0;
        local_1e8.c = 0;
        goto LAB_0031f121;
      }
    }
    iVar10 = *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx[-3]);
    local_98._0_4_ = iVar10;
    uVar15 = iVar10 * iVar10;
    local_f8._0_4_ = *(undefined4 *)(&this->field_0xd8 + (long)this->_vptr_LRN_x86_avx[-3]);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar15,&local_1e9);
    piVar7 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pp_Var1 = this->_vptr_LRN_x86_avx;
    iVar10 = *(int *)(&this->field_0xd4 + (long)pp_Var1[-3]);
    if (0 < iVar10) {
      iVar11 = 0;
      iVar16 = 0;
      iVar20 = 0;
      do {
        if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var1[-3])) {
          lVar24 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar20 + lVar24] = iVar16 + (int)lVar24;
            lVar24 = lVar24 + 1;
            iVar23 = (int)lVar24;
          } while (iVar23 < *(int *)(&this->field_0xd4 + (long)pp_Var1[-3]));
          iVar20 = iVar20 + iVar23;
          iVar16 = iVar16 + iVar23;
        }
        iVar16 = iVar16 + (iVar21 - iVar10);
        iVar11 = iVar11 + 1;
      } while (iVar11 < *(int *)(&this->field_0xd4 + (long)pp_Var1[-3]));
    }
    if (0 < (int)local_188) {
      local_170 = (ulong)(int)local_118;
      local_c8 = bottom_top_blob->data;
      local_d0 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      local_d8 = (Allocator *)local_1e8.data;
      local_e0 = local_1e8.cstep * CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize)
      ;
      local_c0 = (long)local_1e8.w *
                 CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
      local_b8._0_4_ = 1.0 / (float)(int)uVar15;
      local_180 = (Mat *)0x0;
      do {
        if (0 < (int)local_198) {
          local_178 = (_func_int ***)((long)&local_d8->_vptr_Allocator + local_e0 * (long)local_180)
          ;
          pvVar25 = (void *)(local_d0 * (long)local_180 + (long)local_c8);
          pp_Var1 = this->_vptr_LRN_x86_avx;
          local_190 = (Mat *)0x0;
          do {
            ppp_Var13 = local_178;
            if (0 < (int)local_118) {
              lVar24 = local_c0 * (long)local_190;
              uVar27 = 0;
              do {
                if (local_98._0_4_ == 0) {
                  fVar28 = 0.0;
                }
                else {
                  fVar28 = 0.0;
                  uVar14 = 0;
                  do {
                    fVar28 = fVar28 + *(float *)((long)ppp_Var13 +
                                                (long)piVar7[uVar14] * 4 + uVar27 * 4 + lVar24);
                    uVar14 = uVar14 + 1;
                  } while (uVar15 + (uVar15 == 0) != uVar14);
                }
                fVar28 = powf(fVar28 * (float)local_f8._0_4_ * (float)local_b8._0_4_ +
                              *(float *)(&this->field_0xe0 + (long)pp_Var1[-3]),
                              -*(float *)(&this->field_0xdc + (long)pp_Var1[-3]));
                *(float *)((long)pvVar25 + uVar27 * 4) =
                     fVar28 * *(float *)((long)pvVar25 + uVar27 * 4);
                uVar27 = uVar27 + 1;
              } while (uVar27 != local_118);
            }
            pvVar25 = (void *)((long)pvVar25 + local_170 * 4);
            local_190 = (Mat *)((long)&local_190->data + 1);
          } while (local_190 != local_198);
        }
        local_180 = (Mat *)((long)&local_180->data + 1);
      } while (local_180 != local_188);
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar6 = (int *)CONCAT44(local_1e8.refcount._4_4_,(int)local_1e8.refcount);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_1e8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_1e8.data != (Allocator *)0x0) {
            free(local_1e8.data);
          }
        }
        else {
          (*(local_1e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1e8.cstep = 0;
    local_1e8.data = (void *)0x0;
    local_1e8.refcount._0_4_ = 0;
    local_1e8.refcount._4_4_ = 0;
    local_1e8.elemsize._0_4_ = 0;
    local_1e8.elemsize._4_4_ = 0;
    local_1e8.elempack = 0;
    local_1e8.dims = 0;
    local_1e8.w = 0;
    local_1e8.h = 0;
    local_1e8.d = 0;
    local_1e8.c = 0;
  }
  iVar10 = 0;
LAB_0031f121:
  piVar6 = (int *)CONCAT44(local_168.refcount._4_4_,(int)local_168.refcount);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_168.data != (Allocator *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar10;
}

Assistant:

int LRN_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * powf(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}